

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::requantize_int8_to_int8
               (Mat *src,Mat *dst,float scale_in,float scale_out,float *bias,int bias_data_size,
               int fusion_relu,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ModelBinFromMatArray local_988;
  Mat local_978;
  ParamDict local_930;
  
  pLVar3 = create_layer(0x3f);
  ParamDict::ParamDict(&local_930);
  ParamDict::set(&local_930,0,scale_in);
  ParamDict::set(&local_930,1,scale_out);
  ParamDict::set(&local_930,2,(uint)(bias != (float *)0x0));
  ParamDict::set(&local_930,3,bias_data_size);
  ParamDict::set(&local_930,4,fusion_relu);
  (*pLVar3->_vptr_Layer[2])(pLVar3,&local_930);
  local_978.cstep = (size_t)bias_data_size;
  local_978.refcount = (int *)0x0;
  local_978.elemsize = 4;
  local_978.elempack = 1;
  local_978.allocator = (Allocator *)0x0;
  local_978.dims = 1;
  local_978.h = 1;
  local_978.c = 1;
  local_978.data = bias;
  local_978.w = bias_data_size;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_988,&local_978);
  (*pLVar3->_vptr_Layer[3])(pLVar3,&local_988);
  ModelBin::~ModelBin(&local_988.super_ModelBin);
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,dst,opt);
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  if (local_978.refcount != (int *)0x0) {
    LOCK();
    *local_978.refcount = *local_978.refcount + -1;
    UNLOCK();
    if (*local_978.refcount == 0) {
      if (local_978.allocator == (Allocator *)0x0) {
        if ((float *)local_978.data != (float *)0x0) {
          free(local_978.data);
        }
      }
      else {
        (**(code **)(*(long *)local_978.allocator + 0x18))();
      }
    }
  }
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_930.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_930.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

void requantize_int8_to_int8(const Mat& src, Mat& dst, float scale_in, float scale_out, const float* bias, int bias_data_size, int fusion_relu, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in);
    pd.set(1, scale_out);
    pd.set(2, bias ? 1 : 0);
    pd.set(3, bias_data_size);
    pd.set(4, fusion_relu);

    requantize->load_param(pd);

    Mat weights[1];
    weights[0] = Mat(bias_data_size, (void*)bias);

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}